

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_att.c
# Opt level: O0

stack_st_X509_ATTRIBUTE *
X509at_add1_attr_by_OBJ(stack_st_X509_ATTRIBUTE **x,ASN1_OBJECT *obj,int type,uchar *bytes,int len)

{
  X509_ATTRIBUTE *attr_00;
  stack_st_X509_ATTRIBUTE *ret;
  X509_ATTRIBUTE *attr;
  undefined8 local_8;
  
  attr_00 = X509_ATTRIBUTE_create_by_OBJ((X509_ATTRIBUTE **)0x0,obj,type,bytes,len);
  if (attr_00 == (X509_ATTRIBUTE *)0x0) {
    local_8 = (stack_st_X509_ATTRIBUTE *)0x0;
  }
  else {
    local_8 = X509at_add1_attr(x,attr_00);
    X509_ATTRIBUTE_free(attr_00);
  }
  return local_8;
}

Assistant:

STACK_OF(X509_ATTRIBUTE) *X509at_add1_attr_by_OBJ(STACK_OF(X509_ATTRIBUTE)
                                                  **x, const ASN1_OBJECT *obj,
                                                  int type,
                                                  const unsigned char *bytes,
                                                  int len)
{
    X509_ATTRIBUTE *attr;
    STACK_OF(X509_ATTRIBUTE) *ret;
    attr = X509_ATTRIBUTE_create_by_OBJ(NULL, obj, type, bytes, len);
    if (!attr)
        return 0;
    ret = X509at_add1_attr(x, attr);
    X509_ATTRIBUTE_free(attr);
    return ret;
}